

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

ostream * ClipperLib::operator<<(ostream *s,Path *p)

{
  bool bVar1;
  size_type sVar2;
  ulong __n;
  ostream *poVar3;
  const_reference pvVar4;
  ulong local_30;
  size_type i;
  size_type last;
  Path *p_local;
  ostream *s_local;
  
  bVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::empty(p);
  if (!bVar1) {
    sVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size(p);
    __n = sVar2 - 1;
    for (local_30 = 0; local_30 < __n; local_30 = local_30 + 1) {
      poVar3 = std::operator<<(s,"(");
      pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (p,local_30);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pvVar4->X);
      poVar3 = std::operator<<(poVar3,",");
      pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (p,local_30);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pvVar4->Y);
      std::operator<<(poVar3,"), ");
    }
    poVar3 = std::operator<<(s,"(");
    pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (p,__n);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pvVar4->X);
    poVar3 = std::operator<<(poVar3,",");
    pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (p,__n);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pvVar4->Y);
    std::operator<<(poVar3,")\n");
  }
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const Path &p)
{
  if (p.empty()) return s;
  Path::size_type last = p.size() -1;
  for (Path::size_type i = 0; i < last; i++)
    s << "(" << p[i].X << "," << p[i].Y << "), ";
  s << "(" << p[last].X << "," << p[last].Y << ")\n";
  return s;
}